

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# QueryVkImpl.cpp
# Opt level: O0

bool __thiscall Diligent::QueryVkImpl::AllocateQueries(QueryVkImpl *this)

{
  undefined *puVar1;
  Uint32 UVar2;
  Char *pCVar3;
  DeviceContextVkImpl *pDVar4;
  QueryManagerVk *Args_1;
  reference pvVar5;
  undefined8 uVar6;
  char (*in_RCX) [23];
  char (*Args_1_00) [45];
  char (*in_R8) [54];
  char *local_e0;
  undefined1 local_d8 [8];
  string _msg;
  string msg_3;
  value_type *QueryPoolIdx;
  undefined1 local_88 [4];
  Uint32 i;
  string msg_2;
  string msg_1;
  undefined1 local_38 [8];
  string msg;
  QueryVkImpl *this_local;
  
  msg.field_2._8_8_ = this;
  DiscardQueries(this);
  if (this->m_pQueryMgr != (QueryManagerVk *)0x0) {
    FormatString<char[26],char[23]>
              ((string *)local_38,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pQueryMgr == nullptr",in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    in_RCX = (char (*) [23])0x54;
    DebugAssertionFailed
              (pCVar3,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x54);
    std::__cxx11::string::~string((string *)local_38);
  }
  pDVar4 = Diligent::RefCntAutoPtr::operator_cast_to_DeviceContextVkImpl_
                     ((RefCntAutoPtr *)
                      &(this->super_QueryBase<Diligent::EngineVkImplTraits>).m_pContext);
  if (pDVar4 == (DeviceContextVkImpl *)0x0) {
    FormatString<char[26],char[22]>
              ((string *)((long)&msg_2.field_2 + 8),(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pContext != nullptr",(char (*) [22])in_RCX);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x55);
    std::__cxx11::string::~string((string *)(msg_2.field_2._M_local_buf + 8));
  }
  pDVar4 = RefCntAutoPtr<Diligent::DeviceContextVkImpl>::operator->
                     (&(this->super_QueryBase<Diligent::EngineVkImplTraits>).m_pContext);
  Args_1 = DeviceContextVkImpl::GetQueryManager(pDVar4);
  this->m_pQueryMgr = Args_1;
  if (this->m_pQueryMgr == (QueryManagerVk *)0x0) {
    FormatString<char[26],char[23]>
              ((string *)local_88,(Diligent *)"Debug expression failed:\n",
               (char (*) [26])"m_pQueryMgr != nullptr",(char (*) [23])Args_1);
    pCVar3 = (Char *)std::__cxx11::string::c_str();
    DebugAssertionFailed
              (pCVar3,"AllocateQueries",
               "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
               ,0x57);
    std::__cxx11::string::~string((string *)local_88);
  }
  QueryPoolIdx._4_4_ = 0;
  while( true ) {
    Args_1_00 = (char (*) [45])0x1;
    if ((this->super_QueryBase<Diligent::EngineVkImplTraits>).
        super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
        .m_Desc.Type == QUERY_TYPE_DURATION) {
      Args_1_00 = (char (*) [45])0x2;
    }
    if ((uint)Args_1_00 <= QueryPoolIdx._4_4_) break;
    pvVar5 = std::array<unsigned_int,_2UL>::operator[]
                       ((array<unsigned_int,_2UL> *)
                        &(this->super_QueryBase<Diligent::EngineVkImplTraits>).field_0x44,
                        (ulong)QueryPoolIdx._4_4_);
    if (*pvVar5 != 0xffffffff) {
      FormatString<char[26],char[45]>
                ((string *)((long)&_msg.field_2 + 8),(Diligent *)"Debug expression failed:\n",
                 (char (*) [26])"QueryPoolIdx == QueryManagerVk::InvalidIndex",Args_1_00);
      pCVar3 = (Char *)std::__cxx11::string::c_str();
      DebugAssertionFailed
                (pCVar3,"AllocateQueries",
                 "/workspace/llm4binary/github/license_c_cmakelists/DiligentGraphics[P]DiligentCore/Graphics/GraphicsEngineVulkan/src/QueryVkImpl.cpp"
                 ,0x5b);
      std::__cxx11::string::~string((string *)(_msg.field_2._M_local_buf + 8));
    }
    UVar2 = QueryManagerVk::AllocateQuery
                      (this->m_pQueryMgr,
                       (this->super_QueryBase<Diligent::EngineVkImplTraits>).
                       super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                       .m_Desc.Type);
    *pvVar5 = UVar2;
    if (*pvVar5 == 0xffffffff) {
      local_e0 = GetQueryTypeString((this->super_QueryBase<Diligent::EngineVkImplTraits>).
                                    super_DeviceObjectBase<Diligent::IQueryVk,_Diligent::RenderDeviceVkImpl,_Diligent::QueryDesc>
                                    .m_Desc.Type);
      FormatString<char[42],char_const*,char[54]>
                ((string *)local_d8,(Diligent *)"Failed to allocate Vulkan query for type ",
                 (char (*) [42])&local_e0,
                 (char **)". Increase the query pool size in EngineVkCreateInfo.",in_R8);
      puVar1 = DebugMessageCallback;
      if (DebugMessageCallback != (undefined *)0x0) {
        uVar6 = std::__cxx11::string::c_str();
        (*(code *)puVar1)(2,uVar6,0);
      }
      std::__cxx11::string::~string((string *)local_d8);
      DiscardQueries(this);
      return false;
    }
    QueryPoolIdx._4_4_ = QueryPoolIdx._4_4_ + 1;
  }
  return true;
}

Assistant:

bool QueryVkImpl::AllocateQueries()
{
    DiscardQueries();

    VERIFY_EXPR(m_pQueryMgr == nullptr);
    VERIFY_EXPR(m_pContext != nullptr);
    m_pQueryMgr = m_pContext->GetQueryManager();
    VERIFY_EXPR(m_pQueryMgr != nullptr);
    for (Uint32 i = 0; i < (m_Desc.Type == QUERY_TYPE_DURATION ? Uint32{2} : Uint32{1}); ++i)
    {
        auto& QueryPoolIdx = m_QueryPoolIndex[i];
        VERIFY_EXPR(QueryPoolIdx == QueryManagerVk::InvalidIndex);

        QueryPoolIdx = m_pQueryMgr->AllocateQuery(m_Desc.Type);
        if (QueryPoolIdx == QueryManagerVk::InvalidIndex)
        {
            LOG_ERROR_MESSAGE("Failed to allocate Vulkan query for type ", GetQueryTypeString(m_Desc.Type),
                              ". Increase the query pool size in EngineVkCreateInfo.");
            DiscardQueries();
            return false;
        }
    }

    return true;
}